

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O0

void __thiscall
iDynTree::Rotation::Rotation
          (Rotation *this,double xx,double xy,double xz,double yx,double yy,double yz,double zx,
          double zy,double zz)

{
  MatrixFixSize<3U,_3U> *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double in_stack_00000008;
  
  MatrixFixSize<3U,_3U>::MatrixFixSize(in_RDI);
  in_RDI->m_data[0] = in_XMM0_Qa;
  in_RDI->m_data[1] = in_XMM1_Qa;
  in_RDI->m_data[2] = in_XMM2_Qa;
  in_RDI->m_data[3] = in_XMM3_Qa;
  in_RDI->m_data[4] = in_XMM4_Qa;
  in_RDI->m_data[5] = in_XMM5_Qa;
  in_RDI->m_data[6] = in_XMM6_Qa;
  in_RDI->m_data[7] = in_XMM7_Qa;
  in_RDI->m_data[8] = in_stack_00000008;
  return;
}

Assistant:

Rotation::Rotation(double xx, double xy, double xz,
                       double yx, double yy, double yz,
                       double zx, double zy, double zz)
    {
        this->m_data[0] = xx;
        this->m_data[1] = xy;
        this->m_data[2] = xz;
        this->m_data[3] = yx;
        this->m_data[4] = yy;
        this->m_data[5] = yz;
        this->m_data[6] = zx;
        this->m_data[7] = zy;
        this->m_data[8] = zz;
    }